

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

void __thiscall
pbrt::CurveCommon::CurveCommon
          (CurveCommon *this,span<const_pbrt::Point3<float>_> c,Float width0,Float width1,
          CurveType type,span<const_pbrt::Normal3<float>_> norm,Transform *renderFromObject,
          Transform *objectFromRender,bool reverseOrientation)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined8 uVar6;
  undefined4 uVar10;
  undefined4 uVar11;
  ulong uVar7;
  bool bVar12;
  long lVar13;
  size_t sVar14;
  Normal3<float> *pNVar15;
  long in_FS_OFFSET;
  float fVar16;
  undefined1 auVar17 [64];
  float fVar18;
  float fVar25;
  float fVar26;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar27;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int vb;
  size_t va;
  undefined1 extraout_var [60];
  
  pNVar15 = norm.ptr;
  sVar14 = c.n;
  this->type = type;
  *(undefined1 (*) [32])this->cpObj = ZEXT1232(ZEXT812(0));
  *(undefined1 (*) [32])&this->cpObj[1].super_Tuple3<pbrt::Point3,_float>.y = ZEXT1232(ZEXT812(0));
  *(undefined1 (*) [16])this->n = ZEXT816(0) << 0x20;
  this->n[1].super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
  this->n[1].super_Tuple3<pbrt::Normal3,_float>.z = 0.0;
  this->renderFromObject = renderFromObject;
  this->objectFromRender = objectFromRender;
  this->reverseOrientation = reverseOrientation;
  bVar12 = Transform::SwapsHandedness(renderFromObject);
  this->transformSwapsHandedness = bVar12;
  this->width[0] = width0;
  this->width[1] = width1;
  vb = 4;
  va = sVar14;
  if (sVar14 == 4) {
    lVar13 = 0;
    do {
      *(undefined4 *)((long)&this->cpObj[0].super_Tuple3<pbrt::Point3,_float>.z + lVar13) =
           *(undefined4 *)((long)&((c.ptr)->super_Tuple3<pbrt::Point3,_float>).z + lVar13);
      *(undefined8 *)((long)&this->cpObj[0].super_Tuple3<pbrt::Point3,_float>.x + lVar13) =
           *(undefined8 *)((long)&((c.ptr)->super_Tuple3<pbrt::Point3,_float>).x + lVar13);
      lVar13 = lVar13 + 0xc;
    } while (lVar13 != 0x30);
    if (norm.n == 2) {
      fVar16 = (pNVar15->super_Tuple3<pbrt::Normal3,_float>).x;
      uVar2 = (pNVar15->super_Tuple3<pbrt::Normal3,_float>).y;
      uVar8 = (pNVar15->super_Tuple3<pbrt::Normal3,_float>).z;
      auVar19._0_4_ = (float)uVar2 * (float)uVar2;
      auVar19._4_4_ = (float)uVar8 * (float)uVar8;
      auVar19._8_8_ = 0;
      auVar20 = vmovshdup_avx(auVar19);
      fVar16 = fVar16 * fVar16 + auVar19._0_4_ + auVar20._0_4_;
      if (fVar16 < 0.0) {
        fVar16 = sqrtf(fVar16);
      }
      else {
        auVar20 = vsqrtss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
        fVar16 = auVar20._0_4_;
      }
      uVar3 = (pNVar15->super_Tuple3<pbrt::Normal3,_float>).x;
      uVar9 = (pNVar15->super_Tuple3<pbrt::Normal3,_float>).y;
      auVar20._4_4_ = uVar9;
      auVar20._0_4_ = uVar3;
      auVar20._8_8_ = 0;
      auVar28._4_4_ = fVar16;
      auVar28._0_4_ = fVar16;
      auVar28._8_4_ = fVar16;
      auVar28._12_4_ = fVar16;
      auVar20 = vdivps_avx(auVar20,auVar28);
      fVar1 = (pNVar15->super_Tuple3<pbrt::Normal3,_float>).z;
      uVar6 = vmovlps_avx(auVar20);
      this->n[0].super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar6;
      this->n[0].super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar6 >> 0x20);
      this->n[0].super_Tuple3<pbrt::Normal3,_float>.z = fVar1 / fVar16;
      fVar16 = pNVar15[1].super_Tuple3<pbrt::Normal3,_float>.x;
      uVar4 = pNVar15[1].super_Tuple3<pbrt::Normal3,_float>.y;
      uVar10 = pNVar15[1].super_Tuple3<pbrt::Normal3,_float>.z;
      auVar21._0_4_ = (float)uVar4 * (float)uVar4;
      auVar21._4_4_ = (float)uVar10 * (float)uVar10;
      auVar21._8_8_ = 0;
      auVar20 = vmovshdup_avx(auVar21);
      fVar16 = fVar16 * fVar16 + auVar21._0_4_ + auVar20._0_4_;
      if (fVar16 < 0.0) {
        fVar16 = sqrtf(fVar16);
      }
      else {
        auVar20 = vsqrtss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
        fVar16 = auVar20._0_4_;
      }
      uVar5 = pNVar15[1].super_Tuple3<pbrt::Normal3,_float>.x;
      uVar11 = pNVar15[1].super_Tuple3<pbrt::Normal3,_float>.y;
      auVar22._4_4_ = uVar11;
      auVar22._0_4_ = uVar5;
      auVar22._8_8_ = 0;
      auVar29._4_4_ = fVar16;
      auVar29._0_4_ = fVar16;
      auVar29._8_4_ = fVar16;
      auVar29._12_4_ = fVar16;
      auVar20 = vdivps_avx(auVar22,auVar29);
      auVar19 = vmovshdup_avx(auVar20);
      fVar16 = pNVar15[1].super_Tuple3<pbrt::Normal3,_float>.z / fVar16;
      uVar6 = vmovlps_avx(auVar20);
      this->n[1].super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar6;
      this->n[1].super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar6 >> 0x20);
      this->n[1].super_Tuple3<pbrt::Normal3,_float>.z = fVar16;
      uVar7._0_4_ = this->n[0].super_Tuple3<pbrt::Normal3,_float>.x;
      uVar7._4_4_ = this->n[0].super_Tuple3<pbrt::Normal3,_float>.y;
      auVar30._8_8_ = 0;
      auVar30._0_8_ = uVar7;
      auVar21 = vmovshdup_avx(auVar30);
      fVar1 = this->n[0].super_Tuple3<pbrt::Normal3,_float>.z;
      auVar19 = vfmadd213ss_fma(auVar21,auVar19,ZEXT416((uint)(fVar1 * fVar16)));
      auVar21 = vfmsub231ss_fma(ZEXT416((uint)(fVar1 * fVar16)),ZEXT416((uint)fVar1),
                                ZEXT416((uint)fVar16));
      auVar19 = vfmadd231ss_fma(ZEXT416((uint)(auVar19._0_4_ + auVar21._0_4_)),auVar30,auVar20);
      if (0.0 <= auVar19._0_4_) {
        auVar20 = vsubps_avx(auVar20,auVar30);
        auVar24._0_4_ = auVar20._0_4_ * auVar20._0_4_;
        auVar24._4_4_ = auVar20._4_4_ * auVar20._4_4_;
        auVar24._8_4_ = auVar20._8_4_ * auVar20._8_4_;
        auVar24._12_4_ = auVar20._12_4_ * auVar20._12_4_;
        auVar20 = vhaddps_avx(auVar24,auVar24);
        fVar16 = auVar20._0_4_ + (fVar16 - fVar1) * (fVar16 - fVar1);
        if (fVar16 < 0.0) {
          fVar16 = sqrtf(fVar16);
        }
        else {
          auVar20 = vsqrtss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
          fVar16 = auVar20._0_4_;
        }
        auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar16 * 0.5)));
        uVar6 = vcmpss_avx512f(ZEXT416((uint)(fVar16 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
        bVar12 = (bool)((byte)uVar6 & 1);
        fVar16 = asinf((float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * auVar20._0_4_));
        fVar16 = fVar16 + fVar16;
      }
      else {
        fVar18 = (float)(undefined4)uVar7 + auVar20._0_4_;
        fVar25 = (float)uVar7._4_4_ + auVar20._4_4_;
        fVar26 = auVar20._8_4_ + 0.0;
        fVar27 = auVar20._12_4_ + 0.0;
        auVar23._0_4_ = fVar18 * fVar18;
        auVar23._4_4_ = fVar25 * fVar25;
        auVar23._8_4_ = fVar26 * fVar26;
        auVar23._12_4_ = fVar27 * fVar27;
        auVar20 = vhaddps_avx(auVar23,auVar23);
        fVar16 = auVar20._0_4_ + (fVar1 + fVar16) * (fVar1 + fVar16);
        if (fVar16 < 0.0) {
          fVar16 = sqrtf(fVar16);
        }
        else {
          auVar20 = vsqrtss_avx(ZEXT416((uint)fVar16),ZEXT416((uint)fVar16));
          fVar16 = auVar20._0_4_;
        }
        auVar20 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar16 * 0.5)));
        uVar6 = vcmpss_avx512f(ZEXT416((uint)(fVar16 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
        bVar12 = (bool)((byte)uVar6 & 1);
        auVar17._0_4_ = asinf((float)((uint)bVar12 * -0x40800000 + (uint)!bVar12 * auVar20._0_4_));
        auVar17._4_60_ = extraout_var;
        auVar20 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar17._0_16_,ZEXT416(0x40490fdb))
        ;
        fVar16 = auVar20._0_4_;
      }
      this->normalAngle = fVar16;
      fVar16 = sinf(fVar16);
      this->invSinNormalAngle = 1.0 / fVar16;
    }
    *(long *)(in_FS_OFFSET + -0x3f8) = *(long *)(in_FS_OFFSET + -0x3f8) + 1;
    return;
  }
  LogFatal<char_const(&)[9],char_const(&)[2],char_const(&)[9],unsigned_long&,char_const(&)[2],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes.cpp"
             ,0x1ce,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [9])0x7d71ff,
             (char (*) [2])0x8845ef,(char (*) [9])0x7d71ff,&va,(char (*) [2])0x8845ef,&vb);
}

Assistant:

CurveCommon::CurveCommon(pstd::span<const Point3f> c, Float width0, Float width1,
                         CurveType type, pstd::span<const Normal3f> norm,
                         const Transform *renderFromObject,
                         const Transform *objectFromRender, bool reverseOrientation)
    : type(type),
      renderFromObject(renderFromObject),
      objectFromRender(objectFromRender),
      reverseOrientation(reverseOrientation),
      transformSwapsHandedness(renderFromObject->SwapsHandedness()) {
    width[0] = width0;
    width[1] = width1;
    CHECK_EQ(c.size(), 4);
    for (int i = 0; i < 4; ++i)
        cpObj[i] = c[i];
    if (norm.size() == 2) {
        n[0] = Normalize(norm[0]);
        n[1] = Normalize(norm[1]);
        normalAngle = AngleBetween(n[0], n[1]);
        invSinNormalAngle = 1 / std::sin(normalAngle);
    }
    ++nCurves;
}